

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ostream * Eigen::operator<<(ostream *s,
                           DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *m)

{
  ostream *poVar1;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [55];
  allocator local_139;
  string local_138 [32];
  IOFormat local_118;
  EvalReturnType local_30;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *local_18;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *m_local;
  ostream *s_local;
  
  local_18 = m;
  m_local = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)s;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::eval(&local_30,m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138," ",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"\n",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"",&local_211);
  IOFormat::IOFormat(&local_118,-1,0,(string *)local_138,(string *)local_170,(string *)local_198,
                     (string *)local_1c0,(string *)local_1e8,(string *)local_210);
  poVar1 = internal::print_matrix<Eigen::Matrix<double,_1,_1,1,_1,_1>>(s,&local_30,&local_118);
  IOFormat::~IOFormat(&local_118);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_30);
  return poVar1;
}

Assistant:

std::ostream & operator <<
(std::ostream & s,
 const DenseBase<Derived> & m)
{
  return internal::print_matrix(s, m.eval(), EIGEN_DEFAULT_IO_FORMAT);
}